

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O2

void __thiscall
Rml::ControlledLifetimeResource<Rml::ComputedPropertyData>::Shutdown
          (ControlledLifetimeResource<Rml::ComputedPropertyData> *this)

{
  ComputedPropertyData *pCVar1;
  code *pcVar2;
  bool bVar3;
  
  if (this->pointer == (ComputedPropertyData *)0x0) {
    bVar3 = Assert("Shutting down resource that was not initialized, or has been shut down already."
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3e);
    if (!bVar3) goto LAB_00255184;
  }
  if (this->intentionally_leaked == true) {
    bVar3 = Assert("Shutting down resource that was marked as leaked.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x3f);
    if (!bVar3) {
LAB_00255184:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  pCVar1 = this->pointer;
  if (pCVar1 != (ComputedPropertyData *)0x0) {
    ::std::__cxx11::string::~string((string *)&(pCVar1->computed).inherited.language);
  }
  operator_delete(pCVar1,0xf8);
  this->pointer = (ComputedPropertyData *)0x0;
  return;
}

Assistant:

void Shutdown()
	{
		RMLUI_ASSERTMSG(pointer, "Shutting down resource that was not initialized, or has been shut down already.");
		RMLUI_ASSERTMSG(!intentionally_leaked, "Shutting down resource that was marked as leaked.");
		delete pointer;
		pointer = nullptr;
	}